

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::
execute_draw_test(SubroutineFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *this,
                 TestShaderType tested_shader_type,string *function_definition,string *function_use,
                 string *verification,bool use_original,bool expect_invalid_result)

{
  undefined4 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *pTVar5;
  char *pcVar6;
  bool bVar7;
  GLuint vao_id;
  uchar buffer [4];
  GLuint texture_object_id;
  string local_70;
  GLuint framebuffer_object_id;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  prepare_fragment_shader
            ((string *)buffer,this,tested_shader_type,function_definition,function_use,verification)
  ;
  prepare_geometry_shader
            ((string *)&framebuffer_object_id,this,tested_shader_type,function_definition,
             function_use,verification);
  prepare_tess_ctrl_shader
            (&local_70,this,tested_shader_type,function_definition,function_use,verification);
  prepare_tess_eval_shader
            ((string *)&texture_object_id,this,tested_shader_type,function_definition,function_use,
             verification);
  prepare_vertex_shader
            ((string *)&vao_id,this,tested_shader_type,function_definition,function_use,verification
            );
  if (tested_shader_type - COMPUTE_SHADER_TYPE < 4) {
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])
              (this,&vao_id,&local_70,&texture_object_id,&framebuffer_object_id,buffer,
               empty_string_abi_cxx11_,0,0);
  }
  else {
    if (VERTEX_SHADER_TYPE < tested_shader_type) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x2367);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[9])(this,&vao_id,buffer,0,0);
  }
  std::__cxx11::string::~string((string *)&vao_id);
  std::__cxx11::string::~string((string *)&texture_object_id);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&framebuffer_object_id);
  std::__cxx11::string::~string((string *)buffer);
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  framebuffer_object_id = 0;
  texture_object_id = 0;
  vao_id = 0;
  uVar1 = *(undefined4 *)(&DAT_0171cce8 + (long)(int)tested_shader_type * 4);
  pcVar6 = "new_routine";
  if (use_original) {
    pcVar6 = "original_routine";
  }
  (**(code **)(lVar4 + 0x1680))
            ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glUseProgram() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x239e);
  local_70._M_dataplus._M_p._0_4_ =
       (**(code **)(lVar4 + 0xa88))
                 ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id
                  ,uVar1,pcVar6);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetSubroutineIndex() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23a2);
  iVar2 = (**(code **)(lVar4 + 0xa90))
                    ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).
                     program_object_id,uVar1,"routine");
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetSubroutineUniformLocation() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x23a5);
  if (iVar2 == 0) {
    (**(code **)(lVar4 + 0x1668))(uVar1,1,&local_70);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glUniformSubroutinesuiv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23ad);
    (**(code **)(lVar4 + 0x6f8))(1,&texture_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGenTextures() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23b2);
    (**(code **)(lVar4 + 0xb8))(0xde1,texture_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindTexture() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23b5);
    (**(code **)(lVar4 + 0x1380))(0xde1,1,0x8058,1,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glTexStorage2D() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23b8);
    (**(code **)(lVar4 + 0x6d0))(1,&framebuffer_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGenFramebuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23bd);
    (**(code **)(lVar4 + 0x78))(0x8d40,framebuffer_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindFramebuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23c0);
    (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8ce0,0xde1,texture_object_id,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glFramebufferTexture2D() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23c3);
    (**(code **)(lVar4 + 0x1a00))(0,0,1,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glViewport() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23c6);
    (**(code **)(lVar4 + 0x708))(1,&vao_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGenVertexArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23cb);
    (**(code **)(lVar4 + 0xd8))(vao_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindVertexArray() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23ce);
    if (tested_shader_type < COMPUTE_SHADER_TYPE) {
      (**(code **)(lVar4 + 0x538))(6,0,4);
      iVar2 = 0x23d5;
    }
    else if (tested_shader_type - TESSELATION_CONTROL_SHADER_TYPE < 2) {
      (**(code **)(lVar4 + 0xfd8))(0x8e72,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"PatchParameteri",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x23dc);
      (**(code **)(lVar4 + 0x538))(0xe,0,1);
      iVar2 = 0x23df;
    }
    else {
      if (tested_shader_type != GEOMETRY_SHADER_TYPE) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x23e8);
        goto LAB_00b9fab3;
      }
      (**(code **)(lVar4 + 0x538))(0,0,1);
      iVar2 = 0x23e4;
    }
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,iVar2);
    (**(code **)(lVar4 + 0x1218))(0x8ce0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadBuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23ee);
    (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1908,0x1401,buffer);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadPixels() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x23f1);
    bVar7 = buffer[0] == 0xff;
    (**(code **)(lVar4 + 0x1680))(0);
    (**(code **)(lVar4 + 0xb8))(0xde1,0);
    (**(code **)(lVar4 + 0x78))(0x8d40,0);
    (**(code **)(lVar4 + 0xd8))(0);
    (**(code **)(lVar4 + 0x448))
              ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id);
    (this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id = 0;
    (**(code **)(lVar4 + 0x480))(1,&texture_object_id);
    texture_object_id = 0;
    (**(code **)(lVar4 + 0x440))(1,&framebuffer_object_id);
    framebuffer_object_id = 0;
    (**(code **)(lVar4 + 0x490))(1,&vao_id);
    vao_id = 0;
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"An error ocurred while deleting generated objects.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2407);
    if (bVar7 != expect_invalid_result) {
      return;
    }
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid result was returned.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x240b);
  }
  else {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Subroutine location is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x23a9);
  }
LAB_00b9fab3:
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SubroutineFunctionCalls1<API>::execute_draw_test(typename TestCaseBase<API>::TestShaderType tested_shader_type,
													  const std::string&						 function_definition,
													  const std::string& function_use, const std::string& verification,
													  bool use_original, bool expect_invalid_result)
{
	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	if (API::USE_ALL_SHADER_STAGES)
	{
		const std::string& compute_shader_source = empty_string;
		const std::string& fragment_shader_source =
			this->prepare_fragment_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& geometry_shader_source =
			this->prepare_geometry_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& tess_ctrl_shader_source =
			this->prepare_tess_ctrl_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& tess_eval_shader_source =
			this->prepare_tess_eval_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& vertex_shader_source =
			this->prepare_vertex_shader(tested_shader_type, function_definition, function_use, verification);

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
			break;

		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			this->execute_positive_test(vertex_shader_source, tess_ctrl_shader_source, tess_eval_shader_source,
										geometry_shader_source, fragment_shader_source, compute_shader_source, false,
										false);
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}
	else
	{
		const std::string& fragment_shader_source =
			this->prepare_fragment_shader(tested_shader_type, function_definition, function_use, verification);
		const std::string& vertex_shader_source =
			this->prepare_vertex_shader(tested_shader_type, function_definition, function_use, verification);

		this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
	}

	/* We are now ready to verify whether the returned size is correct. */
	unsigned char	  buffer[4]			 = { 0 };
	glw::GLuint		   framebuffer_object_id = 0;
	glw::GLuint		   routine_index		 = -1;
	glw::GLuint		   routine_location		 = -1;
	const glw::GLchar* routine_name			 = "original_routine";
	glw::GLenum		   shader_type			 = 0;
	glw::GLuint		   texture_object_id	 = 0;
	glw::GLuint		   vao_id				 = 0;

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		shader_type = GL_FRAGMENT_SHADER;
		break;
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		shader_type = GL_VERTEX_SHADER;
		break;
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		shader_type = GL_COMPUTE_SHADER;
		break;
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		shader_type = GL_GEOMETRY_SHADER;
		break;
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		shader_type = GL_TESS_CONTROL_SHADER;
		break;
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		shader_type = GL_TESS_EVALUATION_SHADER;
		break;
	default:
		TCU_FAIL("Invalid shader type");
		break;
	}

	if (false == use_original)
	{
		routine_name = "new_routine";
	}

	gl.useProgram(this->program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

	/* Select subroutine */
	routine_index = gl.getSubroutineIndex(this->program_object_id, shader_type, routine_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() failed.");

	routine_location = gl.getSubroutineUniformLocation(this->program_object_id, shader_type, "routine");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() failed.");

	if (0 != routine_location)
	{
		TCU_FAIL("Subroutine location is invalid");
	}

	gl.uniformSubroutinesuiv(shader_type, 1, &routine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() failed.");

	/* Prepre texture */
	assert(0 == texture_object_id);
	gl.genTextures(1, &texture_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed.");

	gl.bindTexture(GL_TEXTURE_2D, texture_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() failed.");

	/* Prepare framebuffer */
	assert(0 == framebuffer_object_id);
	gl.genFramebuffers(1, &framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() failed.");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture_object_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() failed.");

	gl.viewport(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() failed.");

	/* Set VAO */
	assert(0 == vao_id);
	gl.genVertexArrays(1, &vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() failed.");

	gl.bindVertexArray(vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() failed.");

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE: /* Fall through */
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		gl.drawArrays(GL_TRIANGLE_FAN, 0, 4);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		/* Tesselation patch set up */
		gl.patchParameteri(GL_PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

		gl.drawArrays(GL_PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		gl.drawArrays(GL_POINTS, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Verify */
	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer() failed.");

	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed.");

	const bool result = ((buffer[0] != 255) == expect_invalid_result);

	/* Delete generated objects. */
	gl.useProgram(0);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);

	gl.deleteProgram(this->program_object_id);
	this->program_object_id = 0;

	gl.deleteTextures(1, &texture_object_id);
	texture_object_id = 0;

	gl.deleteFramebuffers(1, &framebuffer_object_id);
	framebuffer_object_id = 0;

	gl.deleteVertexArrays(1, &vao_id);
	vao_id = 0;

	GLU_EXPECT_NO_ERROR(gl.getError(), "An error ocurred while deleting generated objects.");

	if (!result)
	{
		TCU_FAIL("Invalid result was returned.");
	}
}